

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

csubstr * __thiscall c4::yml::Tree::val(Tree *this,size_t node)

{
  code *pcVar1;
  bool bVar2;
  csubstr *pcVar3;
  
  if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
    if ((s_error_flags & 1) != 0) {
      bVar2 = is_debugger_attached();
      if (bVar2) {
        pcVar1 = (code *)swi(3);
        pcVar3 = (csubstr *)(*pcVar1)();
        return pcVar3;
      }
    }
    (*(code *)PTR_error_impl_002a27a8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  if ((this->m_buf[node].m_type.type & VAL) == NOTYPE) {
    if ((s_error_flags & 1) != 0) {
      bVar2 = is_debugger_attached();
      if (bVar2) {
        pcVar1 = (code *)swi(3);
        pcVar3 = (csubstr *)(*pcVar1)();
        return pcVar3;
      }
    }
    (*(code *)PTR_error_impl_002a27a8)
              ("check failed: has_val(node)",0x1b,(anonymous_namespace)::s_default_callbacks);
  }
  if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
    if ((s_error_flags & 1) != 0) {
      bVar2 = is_debugger_attached();
      if (bVar2) {
        pcVar1 = (code *)swi(3);
        pcVar3 = (csubstr *)(*pcVar1)();
        return pcVar3;
      }
    }
    (*(code *)PTR_error_impl_002a27a8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  return &this->m_buf[node].m_val.scalar;
}

Assistant:

csubstr    const& val       (size_t node) const { RYML_ASSERT(has_val(node)); return _p(node)->m_val.scalar; }